

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

bool __thiscall kj::_::Mutex::lock(Mutex *this,int exclusivity,char *timeout)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  uint uVar4;
  long *plVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  Maybe<timespec> spec;
  long local_38;
  long local_30;
  
  if (*timeout != '\0') {
    local_38 = *(long *)(timeout + 8) / 1000000000;
    local_30 = *(long *)(timeout + 8) % 1000000000;
  }
  plVar5 = (long *)0x0;
  if (*timeout != '\0') {
    plVar5 = &local_38;
  }
  if (exclusivity == 1) {
    LOCK();
    uVar6 = this->futex;
    this->futex = this->futex + 1;
    UNLOCK();
    uVar6 = uVar6 + 1;
    do {
      bVar10 = -1 < (int)uVar6;
      if (bVar10) {
        return bVar10;
      }
      lVar2 = syscall(0xca,this,0x80,(ulong)uVar6,plVar5,0,0);
      if ((lVar2 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x6e)) {
        LOCK();
        uVar6 = this->futex;
        this->futex = this->futex - 1;
        UNLOCK();
        uVar6 = uVar6 - 1;
        bVar7 = false;
        if (uVar6 == 0x40000000) {
          LOCK();
          uVar6 = this->futex;
          bVar9 = uVar6 == 0x40000000;
          if (bVar9) {
            this->futex = 0;
            uVar6 = 0x40000000;
          }
          UNLOCK();
          if (bVar9) {
            bVar7 = false;
            syscall(0xca,this,0x81,0x7fffffff,0,0,0);
          }
        }
      }
      else {
        uVar6 = this->futex;
        bVar7 = true;
      }
    } while (bVar7);
  }
  else {
    bVar10 = true;
    if (exclusivity == 0) {
      do {
        LOCK();
        uVar1 = this->futex;
        bVar7 = uVar1 == 0;
        if (bVar7) {
          this->futex = 0x80000000;
          uVar1 = 0;
        }
        UNLOCK();
        cVar8 = '\x03';
        if (!bVar7) {
          uVar4 = uVar1;
          if ((uVar1 >> 0x1e & 1) == 0) {
            uVar4 = uVar1 | 0x40000000;
            LOCK();
            bVar7 = uVar1 == this->futex;
            if (bVar7) {
              this->futex = uVar4;
            }
            UNLOCK();
            cVar8 = '\x04';
            if (!bVar7) goto LAB_001af205;
          }
          cVar8 = '\0';
          lVar2 = syscall(0xca,this,0x80,(ulong)uVar4,plVar5,0,0);
          if (lVar2 < 0) {
            piVar3 = __errno_location();
            cVar8 = *piVar3 == 0x6e;
          }
        }
LAB_001af205:
      } while ((cVar8 == '\0') || (cVar8 == '\x04'));
      if (cVar8 != '\x03') {
        bVar10 = false;
      }
    }
  }
  return bVar10;
}

Assistant:

bool Mutex::lock(Exclusivity exclusivity, Maybe<Duration> timeout, LockSourceLocationArg location) {
  BlockedOnReason blockReason = BlockedOnMutexAcquisition{*this, location};
  KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

  auto spec = timeout.map([](Duration d) { return toRelativeTimespec(d); });
  struct timespec* specp = nullptr;
  KJ_IF_SOME(s, spec) {
    specp = &s;
  }

  switch (exclusivity) {
    case EXCLUSIVE:
      for (;;) {
        uint state = 0;
        if (KJ_LIKELY(__atomic_compare_exchange_n(&futex, &state, EXCLUSIVE_HELD, false,
                                                  __ATOMIC_ACQUIRE, __ATOMIC_RELAXED))) {

          // Acquired.
          break;
        }

        // The mutex is contended.  Set the exclusive-requested bit and wait.
        if ((state & EXCLUSIVE_REQUESTED) == 0) {
          if (!__atomic_compare_exchange_n(&futex, &state, state | EXCLUSIVE_REQUESTED, false,
                                           __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
            // Oops, the state changed before we could set the request bit.  Start over.
            continue;
          }

          state |= EXCLUSIVE_REQUESTED;
        }

        setCurrentThreadIsWaitingFor(&blockReason);

        auto result = syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, specp, nullptr, 0);
        if (result < 0) {
          if (errno == ETIMEDOUT) {
            setCurrentThreadIsNoLongerWaiting();
            // We timed out, we can't remove the exclusive request flag (since others might be waiting)
            // so we just return false.
            return false;
          }
        }
      }
#if KJ_CONTENTION_WARNING_THRESHOLD
      printContendedReader = false;
#endif
      break;
    case SHARED: {
#if KJ_CONTENTION_WARNING_THRESHOLD
      kj::Maybe<kj::TimePoint> contentionWaitStart;
#endif

      uint state = __atomic_add_fetch(&futex, 1, __ATOMIC_ACQUIRE);

      for (;;) {
        if (KJ_LIKELY((state & EXCLUSIVE_HELD) == 0)) {
          // Acquired.
          break;
        }

#if KJ_CONTENTION_WARNING_THRESHOLD
        if (contentionWaitStart == kj::none) {
          // We could have the exclusive mutex tell us how long it was holding the lock. That would
          // be the nicest. However, I'm hesitant to bloat the structure. I suspect having a reader
          // tell us how long it was waiting for is probably a good proxy.
          contentionWaitStart = kj::systemPreciseMonotonicClock().now();
        }
#endif

        setCurrentThreadIsWaitingFor(&blockReason);

        // The mutex is exclusively locked by another thread.  Since we incremented the counter
        // already, we just have to wait for it to be unlocked.
        auto result = syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, specp, nullptr, 0);
        if (result < 0) {
          // If we timeout though, we need to signal that we're not waiting anymore.
          if (errno == ETIMEDOUT) {
            setCurrentThreadIsNoLongerWaiting();
            state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELAXED);

            // We may have unlocked since we timed out. So act like we just unlocked the mutex
            // and maybe send a wait signal if needed. See Mutex::unlock SHARED case.
            if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
              if (__atomic_compare_exchange_n(
                  &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
                // Wake all exclusive waiters.  We have to wake all of them because one of them will
                // grab the lock while the others will re-establish the exclusive-requested bit.
                syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
              }
            }
            return false;
          }
        }
        state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);
      }

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      KJ_IF_SOME(start, contentionWaitStart) {
        if (__atomic_load_n(&printContendedReader, __ATOMIC_RELAXED)) {
          // Double-checked lock avoids the CPU needing to acquire the lock in most cases.
          if (__atomic_exchange_n(&printContendedReader, false, __ATOMIC_RELAXED)) {
            auto contentionDuration = kj::systemPreciseMonotonicClock().now() - start;
            KJ_LOG(WARNING, "Acquired contended lock", location, contentionDuration,
                kj::getStackTrace());
          }
        }
      }
#endif

      break;
    }
  }
  return true;
}